

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O2

datatype * __thiscall
mxx::datatype::contiguous(datatype *__return_storage_ptr__,datatype *this,size_t count)

{
  MPI_Datatype *ppoVar1;
  MPI_Datatype _blocks;
  MPI_Datatype _remainder;
  MPI_Aint extent;
  MPI_Datatype _block;
  int blocklen [2];
  MPI_Aint lb;
  MPI_Datatype mpitypes [2];
  MPI_Aint displs [2];
  
  __return_storage_ptr__->_vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
  ppoVar1 = &__return_storage_ptr__->mpitype;
  __return_storage_ptr__->mpitype = (MPI_Datatype)&ompi_mpi_datatype_null;
  __return_storage_ptr__->builtin = false;
  if (count < 0x80000000) {
    MPI_Type_contiguous(count & 0xffffffff,this->mpitype,ppoVar1);
    MPI_Type_commit(ppoVar1);
  }
  else {
    MPI_Type_contiguous(0x7fffffff,this->mpitype,&_block);
    MPI_Type_contiguous(count / 0x7fffffff & 0xffffffff,_block,&_blocks);
    if (count % 0x7fffffff == 0) {
      *ppoVar1 = _blocks;
      MPI_Type_commit(ppoVar1);
    }
    else {
      MPI_Type_contiguous(count % 0x7fffffff,this->mpitype,&_remainder);
      MPI_Type_get_extent(this->mpitype,&lb,&extent);
      blocklen[0] = 1;
      blocklen[1] = 1;
      mpitypes[0] = _blocks;
      mpitypes[1] = _remainder;
      MPI_Type_create_struct(2);
      MPI_Type_commit(ppoVar1);
      MPI_Type_free(&_remainder);
      MPI_Type_free(&_blocks);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

datatype contiguous(size_t count) const {
        datatype result;
        if (count <= mxx::max_int) {
            result.builtin = false;
            MPI_Type_contiguous(count, this->mpitype, &result.mpitype);
            MPI_Type_commit(&result.mpitype);
        } else {
            result.builtin = false;
            // create custom data types of blocks and remainder
            std::size_t intmax = mxx::max_int;
            std::size_t nblocks = count / intmax;
            std::size_t rem = count % intmax;

            // create block and remainder data types
            MPI_Datatype _block;
            MPI_Type_contiguous(mxx::max_int, this->mpitype, &_block);
            MPI_Datatype _blocks;
            // create two contiguous types for blocks and remainder
            MPI_Type_contiguous(nblocks, _block, &_blocks);

            if (rem > 0) {
                MPI_Datatype _remainder;
                MPI_Type_contiguous(rem, this->mpitype, &_remainder);

                // create struct for the concatenation of this type
                MPI_Aint lb, extent;
                MPI_Type_get_extent(this->mpitype, &lb, &extent);
                MPI_Aint displ = nblocks*intmax*extent;
                MPI_Aint displs[2] = {0, displ};
                int blocklen[2] = {1, 1};
                MPI_Datatype mpitypes[2] = {_blocks, _remainder};
                MPI_Type_create_struct(2, blocklen, displs, mpitypes, &result.mpitype);
                MPI_Type_commit(&result.mpitype);
                MPI_Type_free(&_remainder);
                MPI_Type_free(&_blocks);
            } else {
                result.mpitype = _blocks;
                MPI_Type_commit(&result.mpitype);
            }
        }
        return result;
    }